

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indexed_indirect_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_106216::CpuIndexedIndirectTest_sbc_Test::~CpuIndexedIndirectTest_sbc_Test
          (CpuIndexedIndirectTest_sbc_Test *this)

{
  CpuIndexedIndirectTest_sbc_Test *this_local;
  
  ~CpuIndexedIndirectTest_sbc_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuIndexedIndirectTest, sbc) {
    registers.a = 0xD0;
    registers.p = C_FLAG;
    expected.a = 0xE0;
    expected.p = N_FLAG;
    memory_content = 0xF0;

    run_instruction(SBC_INXIND);
}